

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kqueue.c
# Opt level: O3

uint get_fd_used(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int __fd;
  int iVar5;
  rlimit rlim;
  rlimit rStack_38;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,&rStack_38);
  iVar5 = 0x10000;
  if (-1 < iVar1) {
    iVar5 = (int)rStack_38.rlim_max;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar5 == 0) {
    uVar4 = 0;
  }
  else {
    __fd = 0;
    uVar4 = 0;
    do {
      iVar2 = fcntl(__fd,1);
      uVar4 = uVar4 + (iVar2 == 0);
      __fd = __fd + 1;
    } while (iVar5 != __fd);
  }
  *piVar3 = iVar1;
  return uVar4;
}

Assistant:

unsigned int
get_fd_used(void)
{
    unsigned int fd_max = get_fd_limit();
    unsigned int i;
    unsigned int used = 0;
    int our_errno = errno; /* Preserve errno */

#ifdef __linux__
    for (i = 0; i < fd_max; i++) {
        if (fcntl(i, F_GETFD) == 0)
            used++;
    }
#endif

    errno = our_errno;

    return used;
}